

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O0

shared_ptr<helics::apps::App>
anon_unknown.dwarf_d56f0::buildApp(string_view type,string_view appName,FederateInfo *fedInfo)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char *in_RSI;
  element_type *in_RDI;
  shared_ptr<helics::apps::App> sVar3;
  shared_ptr<helics::apps::Clone> *in_stack_fffffffffffffe38;
  element_type *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  FederateInfo *in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  
  __str = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe50,(char *)in_RDI);
  __x._M_str = in_stack_fffffffffffffe70;
  __x._M_len = (size_t)in_stack_fffffffffffffe68;
  __y._M_str = (char *)in_stack_fffffffffffffe60;
  __y._M_len = in_stack_fffffffffffffe58;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::
    make_shared<helics::apps::Player,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Player,void>
              ((shared_ptr<helics::apps::App> *)in_RDI,
               (shared_ptr<helics::apps::Player> *)in_stack_fffffffffffffe38);
    std::shared_ptr<helics::apps::Player>::~shared_ptr((shared_ptr<helics::apps::Player> *)0x1f61af)
    ;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe50,(char *)__str);
    __x_00._M_str = in_stack_fffffffffffffe70;
    __x_00._M_len = (size_t)in_stack_fffffffffffffe68;
    __y_00._M_str = (char *)in_stack_fffffffffffffe60;
    __y_00._M_len = in_stack_fffffffffffffe58;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      std::
      make_shared<helics::apps::Recorder,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Recorder,void>
                ((shared_ptr<helics::apps::App> *)in_RDI,
                 (shared_ptr<helics::apps::Recorder> *)in_stack_fffffffffffffe38);
      std::shared_ptr<helics::apps::Recorder>::~shared_ptr
                ((shared_ptr<helics::apps::Recorder> *)0x1f624f);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe50,(char *)__str);
      __x_01._M_str = in_stack_fffffffffffffe70;
      __x_01._M_len = (size_t)in_stack_fffffffffffffe68;
      __y_01._M_str = (char *)in_stack_fffffffffffffe60;
      __y_01._M_len = in_stack_fffffffffffffe58;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        std::
        make_shared<helics::apps::Connector,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                  (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Connector,void>
                  ((shared_ptr<helics::apps::App> *)in_RDI,
                   (shared_ptr<helics::apps::Connector> *)in_stack_fffffffffffffe38);
        std::shared_ptr<helics::apps::Connector>::~shared_ptr
                  ((shared_ptr<helics::apps::Connector> *)0x1f62ef);
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe50,(char *)__str);
        __x_02._M_str = in_stack_fffffffffffffe70;
        __x_02._M_len = (size_t)in_stack_fffffffffffffe68;
        __y_02._M_str = (char *)in_stack_fffffffffffffe60;
        __y_02._M_len = in_stack_fffffffffffffe58;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          std::
          make_shared<helics::apps::Echo,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Echo,void>
                    ((shared_ptr<helics::apps::App> *)in_RDI,
                     (shared_ptr<helics::apps::Echo> *)in_stack_fffffffffffffe38);
          std::shared_ptr<helics::apps::Echo>::~shared_ptr
                    ((shared_ptr<helics::apps::Echo> *)0x1f638f);
          _Var2._M_pi = extraout_RDX_02;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffe50,(char *)__str);
          __x_03._M_str = in_stack_fffffffffffffe70;
          __x_03._M_len = (size_t)in_stack_fffffffffffffe68;
          __y_03._M_str = (char *)in_stack_fffffffffffffe60;
          __y_03._M_len = in_stack_fffffffffffffe58;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            std::
            make_shared<helics::apps::Clone,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
            std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Clone,void>
                      ((shared_ptr<helics::apps::App> *)in_RDI,in_stack_fffffffffffffe38);
            std::shared_ptr<helics::apps::Clone>::~shared_ptr
                      ((shared_ptr<helics::apps::Clone> *)0x1f642f);
            _Var2._M_pi = extraout_RDX_03;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffe50,(char *)__str);
            __x_04._M_str = in_stack_fffffffffffffe70;
            __x_04._M_len = (size_t)in_stack_fffffffffffffe68;
            __y_04._M_str = (char *)in_stack_fffffffffffffe60;
            __y_04._M_len = in_stack_fffffffffffffe58;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              std::
              make_shared<helics::apps::Probe,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                        (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
              std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Probe,void>
                        ((shared_ptr<helics::apps::App> *)in_RDI,
                         (shared_ptr<helics::apps::Probe> *)in_stack_fffffffffffffe38);
              std::shared_ptr<helics::apps::Probe>::~shared_ptr
                        ((shared_ptr<helics::apps::Probe> *)0x1f64c6);
              _Var2._M_pi = extraout_RDX_04;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffe50,(char *)__str);
              __x_05._M_str = in_stack_fffffffffffffe70;
              __x_05._M_len = (size_t)in_stack_fffffffffffffe68;
              __y_05._M_str = (char *)in_stack_fffffffffffffe60;
              __y_05._M_len = in_stack_fffffffffffffe58;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                std::
                make_shared<helics::apps::Tracer,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                          (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
                std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Tracer,void>
                          ((shared_ptr<helics::apps::App> *)in_RDI,
                           (shared_ptr<helics::apps::Tracer> *)in_stack_fffffffffffffe38);
                std::shared_ptr<helics::apps::Tracer>::~shared_ptr
                          ((shared_ptr<helics::apps::Tracer> *)0x1f6548);
                _Var2._M_pi = extraout_RDX_05;
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffffe50,(char *)__str);
                __x_06._M_str = in_RSI;
                __x_06._M_len = (size_t)in_stack_fffffffffffffe68;
                __y_06._M_str = (char *)in_stack_fffffffffffffe60;
                __y_06._M_len = in_stack_fffffffffffffe58;
                bVar1 = std::operator==(__x_06,__y_06);
                if (bVar1) {
                  std::
                  make_shared<helics::apps::Source,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
                  std::shared_ptr<helics::apps::App>::shared_ptr<helics::apps::Source,void>
                            ((shared_ptr<helics::apps::App> *)in_RDI,
                             (shared_ptr<helics::apps::Source> *)in_stack_fffffffffffffe38);
                  std::shared_ptr<helics::apps::Source>::~shared_ptr
                            ((shared_ptr<helics::apps::Source> *)0x1f65ca);
                  _Var2._M_pi = extraout_RDX_06;
                }
                else {
                  std::shared_ptr<helics::apps::App>::shared_ptr
                            ((shared_ptr<helics::apps::App> *)in_RDI,in_stack_fffffffffffffe38);
                  _Var2._M_pi = extraout_RDX_07;
                }
              }
            }
          }
        }
      }
    }
  }
  sVar3.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __str;
  return (shared_ptr<helics::apps::App>)
         sVar3.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::apps::App> buildApp(std::string_view type, std::string_view appName, helics::FederateInfo& fedInfo)
{
    if (type == "player") {
        return std::make_shared<helics::apps::Player>(appName, fedInfo);
    }
    if (type == "recorder") {
        return std::make_shared<helics::apps::Recorder>(appName, fedInfo);
    }
    if (type == "connector") {
        return std::make_shared<helics::apps::Connector>(appName, fedInfo);
    }
    if (type == "echo") {
        return std::make_shared<helics::apps::Echo>(appName, fedInfo);
    }
    if (type == "clone") {
        return std::make_shared<helics::apps::Clone>(appName, fedInfo);
    }
    if (type == "probe") {
        return std::make_shared<helics::apps::Probe>(appName, fedInfo);
    }
    if (type == "tracer") {
        return std::make_shared<helics::apps::Tracer>(appName, fedInfo);
    }
    if (type == "source") {
        return std::make_shared<helics::apps::Source>(appName, fedInfo);
    }
    return nullptr;
}